

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

Optional<llvm::RelocAddrEntry> * __thiscall
anon_unknown.dwarf_27e0899::DWARFObjInMemory::find
          (Optional<llvm::RelocAddrEntry> *__return_storage_ptr__,DWARFObjInMemory *this,
          DWARFSection *S,uint64_t Pos)

{
  bool bVar1;
  pointer pvVar2;
  const_iterator local_48;
  undefined1 local_38 [8];
  const_iterator AI;
  DWARFSectionMap *Sec;
  uint64_t Pos_local;
  DWARFSection *S_local;
  DWARFObjInMemory *this_local;
  
  AI.End = (pointer)S;
  Sec = (DWARFSectionMap *)Pos;
  Pos_local = (uint64_t)S;
  S_local = (DWARFSection *)this;
  _local_38 = llvm::
              DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
              ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                      *)(S + 1),(const_arg_type_t<unsigned_long>)&Sec);
  local_48 = llvm::
             DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
             ::end((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                    *)&((AI.End)->super_pair<unsigned_long,_llvm::RelocAddrEntry>).second.Reloc);
  bVar1 = llvm::
          DenseMapIterator<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>,_true>
          ::operator==((DenseMapIterator<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>,_true>
                        *)local_38,&local_48);
  if (bVar1) {
    llvm::Optional<llvm::RelocAddrEntry>::Optional(__return_storage_ptr__,None);
  }
  else {
    pvVar2 = llvm::
             DenseMapIterator<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>,_true>
             ::operator->((DenseMapIterator<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>,_true>
                           *)local_38);
    llvm::Optional<llvm::RelocAddrEntry>::Optional
              (__return_storage_ptr__,
               &(pvVar2->super_pair<unsigned_long,_llvm::RelocAddrEntry>).second);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<RelocAddrEntry> find(const DWARFSection &S,
                                uint64_t Pos) const override {
    auto &Sec = static_cast<const DWARFSectionMap &>(S);
    RelocAddrMap::const_iterator AI = Sec.Relocs.find(Pos);
    if (AI == Sec.Relocs.end())
      return None;
    return AI->second;
  }